

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O3

void __thiscall
flatbuffers::php::PhpGenerator::GetUnionField(PhpGenerator *this,FieldDef *field,string *code_ptr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 *puVar3;
  long *plVar4;
  size_type *psVar5;
  ulong *puVar6;
  ulong uVar7;
  undefined8 uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  paVar1 = &local_d0.field_2;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,Indent_abi_cxx11_,DAT_003ebcb0 + Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_d0);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_d0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_90 = &local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,Indent_abi_cxx11_,DAT_003ebcb0 + Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,
             *(char **)(GenTypeBasic[abi:cxx11](flatbuffers::Type_const&)::ctypename +
                       (ulong)(field->value).type.base_type * 8),(allocator<char> *)&local_50);
  uVar7 = 0xf;
  if (local_90 != &local_80) {
    uVar7 = local_80;
  }
  if (uVar7 < local_70._M_string_length + local_88) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      uVar8 = local_70.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_70._M_string_length + local_88) goto LAB_002687d2;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_90);
  }
  else {
LAB_002687d2:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70._M_dataplus._M_p);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  psVar5 = puVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_b0.field_2._M_allocated_capacity = *psVar5;
    local_b0.field_2._8_8_ = puVar3[3];
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar5;
    local_b0._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_b0._M_string_length = puVar3[1];
  *puVar3 = psVar5;
  puVar3[1] = 0;
  *(undefined1 *)psVar5 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
  psVar5 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_d0.field_2._M_allocated_capacity = *psVar5;
    local_d0.field_2._8_8_ = plVar4[3];
    local_d0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar5;
    local_d0._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_d0._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_d0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,Indent_abi_cxx11_,DAT_003ebcb0 + Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_d0);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_d0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,Indent_abi_cxx11_,DAT_003ebcb0 + Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_d0);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_d0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  ConvertCase(&local_b0,(string *)field,kUpperCamel,kSnake);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
  psVar5 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_d0.field_2._M_allocated_capacity = *psVar5;
    local_d0.field_2._8_8_ = plVar4[3];
    local_d0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar5;
    local_d0._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_d0._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_d0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,Indent_abi_cxx11_,DAT_003ebcb0 + Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_d0);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_d0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_80 = *puVar6;
    lStack_78 = plVar4[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar6;
    local_90 = (ulong *)*plVar4;
  }
  local_88 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  NumToString<unsigned_short>(&local_50,(field->value).offset);
  uVar7 = 0xf;
  if (local_90 != &local_80) {
    uVar7 = local_80;
  }
  if (uVar7 < local_50._M_string_length + local_88) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      uVar8 = local_50.field_2._M_allocated_capacity;
    }
    if (local_50._M_string_length + local_88 <= (ulong)uVar8) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_90);
      goto LAB_00268ba0;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_50._M_dataplus._M_p);
LAB_00268ba0:
  psVar5 = puVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_b0.field_2._M_allocated_capacity = *psVar5;
    local_b0.field_2._8_8_ = puVar3[3];
    local_b0._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar5;
    local_b0._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_b0._M_string_length = puVar3[1];
  *puVar3 = psVar5;
  puVar3[1] = 0;
  *(undefined1 *)psVar5 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
  psVar5 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_d0.field_2._M_allocated_capacity = *psVar5;
    local_d0.field_2._8_8_ = plVar4[3];
    local_d0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar5;
    local_d0._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_d0._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_d0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_d0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)code_ptr);
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,Indent_abi_cxx11_,DAT_003ebcb0 + Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_d0);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_d0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GetUnionField(const FieldDef &field, std::string *code_ptr) {
    std::string &code = *code_ptr;

    code += Indent + "/**\n";
    code += Indent + " * @return" + GenTypeBasic(field.value.type) + "\n";
    code += Indent + " */\n";
    code += Indent + "public function get";
    code += ConvertCase(field.name, Case::kUpperCamel) + "($obj)\n";
    code += Indent + "{\n";
    code += Indent + Indent + "$o = $this->__offset(" +
            NumToString(field.value.offset) + ");\n";
    code += Indent + Indent;
    code += "return $o != 0 ? $this->__union($obj, $o) : null;\n";
    code += Indent + "}\n\n";
  }